

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::BeginRendering
          (VulkanCommandBuffer *this,VkRenderingInfoKHR *RenderingInfo,size_t Hash)

{
  Char *pCVar1;
  char (*in_RCX) [32];
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  size_t Hash_local;
  VkRenderingInfoKHR *RenderingInfo_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = Hash;
  if ((this->m_State).RenderPass != (VkRenderPass)0x0) {
    Diligent::FormatString<char[45]>
              ((string *)local_40,(char (*) [45])"Another render pass has already been started");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [32])0x167;
    Diligent::DebugAssertionFailed
              (pCVar1,"BeginRendering",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x167);
    std::__cxx11::string::~string((string *)local_40);
  }
  if ((this->m_State).DynamicRenderingHash != 0) {
    Diligent::FormatString<char[28]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [28])"Rendering has already begun");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [32])0x168;
    Diligent::DebugAssertionFailed
              (pCVar1,"BeginRendering",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x168);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_90,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"BeginRendering",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x169);
    std::__cxx11::string::~string((string *)local_90);
  }
  if ((this->m_State).DynamicRenderingHash != msg.field_2._8_8_) {
    FlushBarriers(this);
    (*vkCmdBeginRenderingKHR)(this->m_VkCmdBuffer,RenderingInfo);
    (this->m_State).DynamicRenderingHash = msg.field_2._8_8_;
  }
  return;
}

Assistant:

__forceinline void BeginRendering(const VkRenderingInfoKHR& RenderingInfo, size_t Hash)
    {
        VERIFY(m_State.RenderPass == VK_NULL_HANDLE, "Another render pass has already been started");
        VERIFY(m_State.DynamicRenderingHash == 0, "Rendering has already begun");
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);

        if (m_State.DynamicRenderingHash != Hash)
        {
            FlushBarriers();

            vkCmdBeginRenderingKHR(m_VkCmdBuffer, &RenderingInfo);
            m_State.DynamicRenderingHash = Hash;
        }
    }